

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osThread.cpp
# Opt level: O3

void osThread::USleep(unsigned_long us,char *file,int line)

{
  void *pvVar1;
  
  pvVar1 = pthread_getspecific(tlsKey);
  if (pvVar1 != (void *)0x0) {
    *(char **)((long)pvVar1 + 0x100) = file;
    *(int *)((long)pvVar1 + 0x108) = line;
    *(unsigned_long *)((long)pvVar1 + 0xd8) = us;
    usleep((__useconds_t)us);
    *(undefined8 *)((long)pvVar1 + 0xd8) = 0;
    return;
  }
  usleep((__useconds_t)us);
  return;
}

Assistant:

void osThread::USleep(unsigned long us, const char* file, int line)
{
    osThread* thread = GetCurrent();

    if (thread != nullptr)
    {
        thread->Filename = file;
        thread->Linenumber = line;

        thread->USleepTime = us;
#ifdef _WIN32
        SleepEx(us / 1000, true);
#elif __linux__
        usleep(us);
#endif
        thread->USleepTime = 0;
    }
    else
    {
#ifdef _WIN32
        SleepEx(us / 1000, true);
#elif __linux__
        usleep(us);
#endif
    }
}